

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpExtractHeaders(SyString *pRequest,SySet *pOut)

{
  bool bVar1;
  sxi32 sVar2;
  sxi32 rc;
  sxu8 bEol;
  SyhttpHeader sHdr;
  SyString sCurrent;
  SyhttpHeader *pLast;
  SySet *pOut_local;
  SyString *pRequest_local;
  
  sCurrent.nByte = 0;
  sCurrent._12_4_ = 0;
  if (pOut->nUsed != 0) {
    sCurrent._8_8_ = SySetAt(pOut,pOut->nUsed - 1);
  }
  bVar1 = false;
  do {
    SyZero(&rc,0x20);
    sVar2 = VmGetNextLine(pRequest,(SyString *)&sHdr.sValue.nByte);
    if (sVar2 != 0) {
      if ((sxu32)sCurrent.zString == 0) {
        return 0;
      }
      bVar1 = true;
    }
    sVar2 = VmHttpProcessOneHeader
                      ((SyhttpHeader *)&rc,(SyhttpHeader *)sCurrent._8_8_,(char *)sHdr.sValue._8_8_,
                       (sxu32)sCurrent.zString);
    if (sVar2 == 0) {
      sVar2 = SySetPut(pOut,&rc);
      if (sVar2 != 0) {
        return 0;
      }
      sCurrent._8_8_ = SySetPeek(pOut);
    }
  } while (!bVar1);
  return 0;
}

Assistant:

static sxi32 VmHttpExtractHeaders(SyString *pRequest, SySet *pOut)
 {
	 SyhttpHeader *pLast = 0;
	 SyString sCurrent;
	 SyhttpHeader sHdr;
	 sxu8 bEol;
	 sxi32 rc;
	 if( SySetUsed(pOut) > 0 ){
		 pLast = (SyhttpHeader *)SySetAt(pOut, SySetUsed(pOut)-1);
	 }
	 bEol = FALSE;
	 for(;;){
		 SyZero(&sHdr, sizeof(SyhttpHeader));
		 /* Extract a single line from the raw HTTP request */
		 rc = VmGetNextLine(pRequest, &sCurrent);
		 if(rc != SXRET_OK ){
			 if( sCurrent.nByte < 1 ){
				 break;
			 }
			 bEol = TRUE;
		 }
		 /* Process the header */
		 if( SXRET_OK == VmHttpProcessOneHeader(&sHdr, pLast, sCurrent.zString, sCurrent.nByte)){
			 if( SXRET_OK != SySetPut(pOut, (const void *)&sHdr) ){
				 break;
			 }
			 /* Retrieve the last parsed header so we can handle multi-line header
			  * in case we face one of them.
			  */
			 pLast = (SyhttpHeader *)SySetPeek(pOut);
		 }
		 if( bEol ){
			 break;
		 }
	 } /* for(;;) */
	 return SXRET_OK;
 }